

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_ldc_w(ExecutionEngine *this)

{
  uchar uVar1;
  ushort uVar2;
  uint uVar3;
  cp_info *pcVar4;
  double dVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar9;
  cp_info **ppcVar10;
  StringObject *this_02;
  ostream *poVar11;
  ulong uVar12;
  undefined8 uVar13;
  uint uVar14;
  char *pcVar15;
  Value operand;
  undefined1 *puStack_60;
  string local_58;
  double local_38;
  allocator local_29;
  
  puStack_60 = (undefined1 *)0x1195cc;
  this_00 = VMStack::getInstance();
  puStack_60 = (undefined1 *)0x1195d4;
  this_01 = VMStack::getTopFrame(this_00);
  puStack_60 = (undefined1 *)0x1195e1;
  puVar9 = Frame::getCode(this_01,this_01->pc);
  uVar12 = (ulong)(ushort)(*(ushort *)(puVar9 + 1) << 8 | *(ushort *)(puVar9 + 1) >> 8);
  puStack_60 = (undefined1 *)0x1195f5;
  ppcVar10 = Frame::getConstantPool(this_01);
  pcVar4 = *ppcVar10;
  uVar1 = pcVar4[uVar12 - 1].tag;
  uVar3 = pcVar4[uVar12 - 1].info.long_info.high_bytes;
  this_02 = (StringObject *)(ulong)uVar3;
  if (uVar1 == '\x03') {
    uVar12 = 0;
    uVar13 = 0x400000004;
  }
  else if (uVar1 == '\x04') {
    uVar14 = uVar3 >> 0x17 & 0xff;
    uVar7 = uVar3 & 0x7fffff | 0x800000;
    if (uVar14 == 0) {
      uVar7 = uVar3 * 2 & 0xfffffe;
    }
    uVar8 = -uVar7;
    if (-1 < (int)uVar3) {
      uVar8 = uVar7;
    }
    local_38 = (double)(int)uVar8;
    puStack_60 = (undefined1 *)0x1196b9;
    dVar5 = ldexp(1.0,uVar14 - 0x96);
    this_02 = (StringObject *)(ulong)(uint)(float)(dVar5 * local_38);
    uVar13 = 0x500000000;
    uVar12 = 0;
  }
  else {
    if (uVar1 != '\b') {
      puStack_60 = (undefined1 *)0x119768;
      poVar11 = std::operator<<((ostream *)&std::cerr,
                                "ldc_w tentando acessar um elemento da CP invalido: ");
      puStack_60 = (undefined1 *)0x119774;
      poVar11 = std::operator<<(poVar11,uVar1);
      puStack_60 = (undefined1 *)0x11977c;
      std::endl<char,std::char_traits<char>>(poVar11);
      puStack_60 = (undefined1 *)0x119784;
      exit(1);
    }
    uVar12 = (ulong)this_02 & 0xffff;
    if (pcVar4[uVar12 - 1].tag != '\x01') {
      puStack_60 = &LAB_001197a3;
      __assert_fail("utf8Entry.tag == CONSTANT_Utf8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x1a4,"void ExecutionEngine::i_ldc_w()");
    }
    puVar9 = pcVar4[uVar12 - 1].info.utf8_info.bytes;
    uVar2 = pcVar4[uVar12 - 1].info.fieldref_info.class_index;
    lVar6 = -(ulong)(uVar2 + 0x10 & 0xfffffff0);
    pcVar15 = (char *)((long)&local_58 + lVar6);
    for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
      pcVar15[uVar12] = puVar9[uVar12];
    }
    pcVar15[uVar2] = '\0';
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x28;
    uVar12 = *(ulong *)((long)&puStack_60 + lVar6);
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x1196f2;
    this_02 = (StringObject *)operator_new(uVar12);
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x119705;
    std::__cxx11::string::string((string *)&local_58,pcVar15,&local_29);
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x119711;
    StringObject::StringObject(this_02,&local_58);
    uVar12 = (ulong)this_02 & 0xffffffff00000000;
    *(undefined8 *)((long)&puStack_60 + lVar6) = 0x11972a;
    std::__cxx11::string::~string((string *)&local_58);
    uVar13 = 0x900000000;
  }
  operand.data.longValue = (ulong)this_02 & 0xffffffff | uVar12;
  puStack_60 = (undefined1 *)0x119745;
  operand.printType = (int)uVar13;
  operand.type = (int)((ulong)uVar13 >> 0x20);
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 3;
  return;
}

Assistant:

void ExecutionEngine::i_ldc_w() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    u2 index = (byte1 << 8) | byte2;
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info entry = constantPool[index-1];
    
    Value value;
    
    if (entry.tag == CONSTANT_String) {
        cp_info utf8Entry = constantPool[entry.info.string_info.string_index-1];
        assert(utf8Entry.tag == CONSTANT_Utf8);
        
        u1* bytes = utf8Entry.info.utf8_info.bytes;
        char utf8String[utf8Entry.info.utf8_info.length+1];
        int i;
        for (i = 0; i < utf8Entry.info.utf8_info.length; i++) {
            utf8String[i] = bytes[i];
        }
        utf8String[i] = '\0';
        
        value.type = ValueType::REFERENCE;
        value.data.object = new StringObject(utf8String);
    } else if (entry.tag == CONSTANT_Integer) {
        value.printType = ValueType::INT;
        value.type = ValueType::INT;
        value.data.intValue = entry.info.integer_info.bytes;
    } else if (entry.tag == CONSTANT_Float) {
        u4 floatBytes = entry.info.float_info.bytes;
        int s = ((floatBytes >> 31) == 0) ? 1 : -1;
        int e = ((floatBytes >> 23) & 0xff);
        int m = (e == 0) ? (floatBytes & 0x7fffff) << 1 : (floatBytes & 0x7fffff) | 0x800000;
        
        float number = s*m*pow(2, e-150);
        value.type = ValueType::FLOAT;
        value.data.floatValue = number;
    } else {
        cerr << "ldc_w tentando acessar um elemento da CP invalido: " << entry.tag << endl;
        exit(1);
    }
    
    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 3;
}